

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

void cyclic_refresh_reset_resize(AV1_COMP *cpi)

{
  long lVar1;
  long in_RDI;
  CYCLIC_REFRESH *cr;
  AV1_COMMON *cm;
  
  lVar1 = *(long *)(in_RDI + 0x712a8);
  memset(*(void **)(lVar1 + 0x28),0,(long)(*(int *)(in_RDI + 0x3c194) * *(int *)(in_RDI + 0x3c198)))
  ;
  *(undefined4 *)(lVar1 + 0xc) = 0;
  *(undefined4 *)(lVar1 + 0x10) = 0;
  *(undefined1 *)(in_RDI + 0x42d78) = 1;
  *(undefined4 *)(lVar1 + 0x68) = 0;
  *(undefined4 *)(lVar1 + 0x70) = 0;
  *(undefined4 *)(lVar1 + 4) = 5;
  *(undefined8 *)(lVar1 + 0x50) = 0x3fd0000000000000;
  return;
}

Assistant:

static void cyclic_refresh_reset_resize(AV1_COMP *const cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  memset(cr->map, 0, cm->mi_params.mi_rows * cm->mi_params.mi_cols);
  cr->sb_index = 0;
  cr->last_sb_index = 0;
  cpi->refresh_frame.golden_frame = true;
  cr->apply_cyclic_refresh = 0;
  cr->counter_encode_maxq_scene_change = 0;
  cr->percent_refresh_adjustment = 5;
  cr->rate_ratio_qdelta_adjustment = 0.25;
}